

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_filter_8_3_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  v128 row1_1;
  v128 row0_1;
  int i_1;
  uint16_t *dst16_1;
  uint8_t *dst8_1;
  int local_6f4;
  int local_684;
  undefined8 local_4b8;
  undefined8 local_478;
  ulong uStack_2e0;
  ulong uStack_2b0;
  undefined4 local_1b8;
  undefined4 local_188;
  undefined4 local_158;
  undefined4 local_128;
  int dir_local;
  int sec_strength_local;
  int pri_strength_local;
  uint16_t *in_local;
  int dstride_local;
  void *dest_local;
  v128 res_128;
  v128 row1;
  v128 row0;
  int i;
  uint16_t *dst16;
  uint8_t *dst8;
  
  if (block_width == 8) {
    for (local_6f4 = 0; local_6f4 < block_height; local_6f4 = local_6f4 + 2) {
      auVar6 = vpackuswb_avx(*(undefined1 (*) [16])(in + local_6f4 * 0x90),
                             *(undefined1 (*) [16])(in + (local_6f4 + 1) * 0x90));
      uStack_2e0 = SUB168(ZEXT816(0),4);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uStack_2e0;
      auVar7 = vpunpcklqdq_avx(auVar6,auVar3 << 0x40);
      local_478 = auVar7._0_8_;
      *(undefined8 *)((long)dest + (long)(local_6f4 * dstride)) = local_478;
      auVar6 = vpsrldq_avx(auVar6,8);
      local_4b8 = auVar6._0_8_;
      *(undefined8 *)((long)dest + (long)((local_6f4 + 1) * dstride)) = local_4b8;
    }
  }
  else {
    for (local_684 = 0; local_684 < block_height; local_684 = local_684 + 4) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(in + (local_684 * 0x90 + 0x90));
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(in + local_684 * 0x90);
      auVar6 = vpunpcklqdq_avx(auVar2,auVar6);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(in + (local_684 * 0x90 + 0x1b0));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(in + (local_684 * 0x90 + 0x120));
      auVar7 = vpunpcklqdq_avx(auVar1,auVar7);
      auVar6 = vpackuswb_avx(auVar6,auVar7);
      uStack_2b0 = SUB168(ZEXT816(0),4);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uStack_2b0;
      auVar7 = vpunpcklqdq_avx(auVar6,auVar4 << 0x40);
      auVar7 = vpsrldq_avx(auVar7,4);
      local_188 = auVar7._0_4_;
      *(undefined4 *)((long)dest + (long)(local_684 * dstride)) = local_188;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uStack_2b0;
      auVar7 = vpunpcklqdq_avx(auVar6,auVar5 << 0x40);
      local_128 = auVar7._0_4_;
      *(undefined4 *)((long)dest + (long)((local_684 + 1) * dstride)) = local_128;
      auVar7 = vpsrldq_avx(auVar6,8);
      auVar7 = vpsrldq_avx(auVar7,4);
      local_1b8 = auVar7._0_4_;
      *(undefined4 *)((long)dest + (long)((local_684 + 2) * dstride)) = local_1b8;
      auVar6 = vpsrldq_avx(auVar6,8);
      local_158 = auVar6._0_4_;
      *(undefined4 *)((long)dest + (long)((local_684 + 3) * dstride)) = local_158;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_3)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  (void)pri_strength;
  (void)sec_strength;
  (void)dir;
  (void)pri_damping;
  (void)sec_damping;
  (void)coeff_shift;
  (void)block_width;

  if (block_width == 8) {
    copy_block_8xh(/*is_lowbd=*/1, dest, dstride, in, block_height);
  } else {
    copy_block_4xh(/*is_lowbd=*/1, dest, dstride, in, block_height);
  }
}